

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::RemoveContextHook(ImGuiContext *ctx,ImGuiID hook_id)

{
  ImGuiContextHook *pIVar1;
  int n;
  int i;
  ImVector<ImGuiContextHook> *this;
  
  if (hook_id != 0) {
    this = &ctx->Hooks;
    for (i = 0; i < this->Size; i = i + 1) {
      pIVar1 = ImVector<ImGuiContextHook>::operator[](this,i);
      if (*(ImGuiID *)pIVar1 == hook_id) {
        pIVar1 = ImVector<ImGuiContextHook>::operator[](this,i);
        *(undefined4 *)(pIVar1 + 4) = 7;
      }
    }
    return;
  }
  __assert_fail("hook_id != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                ,0xd66,"void ImGui::RemoveContextHook(ImGuiContext *, ImGuiID)");
}

Assistant:

void ImGui::RemoveContextHook(ImGuiContext* ctx, ImGuiID hook_id)
{
    ImGuiContext& g = *ctx;
    IM_ASSERT(hook_id != 0);
    for (int n = 0; n < g.Hooks.Size; n++)
        if (g.Hooks[n].HookId == hook_id)
            g.Hooks[n].Type = ImGuiContextHookType_PendingRemoval_;
}